

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void proto2_unittest::TestCamelCaseFieldNames::SharedDtor(MessageLite *self)

{
  ForeignMessage *this;
  ulong uVar1;
  
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
    uVar1 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[9]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 10));
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[10]._internal_metadata_);
    this = (ForeignMessage *)self[0xb]._vptr_MessageLite;
    if (this != (ForeignMessage *)0x0) {
      ForeignMessage::~ForeignMessage(this);
    }
    operator_delete(this,0x20);
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(self + 8));
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&self[6]._internal_metadata_);
    google::protobuf::RepeatedPtrField<proto2_unittest::ForeignMessage>::~RepeatedPtrField
              ((RepeatedPtrField<proto2_unittest::ForeignMessage> *)(self + 5));
    google::protobuf::RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 4));
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&self[2]._internal_metadata_);
    google::protobuf::RepeatedField<int>::~RepeatedField
              ((RepeatedField<int> *)&self[1]._internal_metadata_);
    return;
  }
  SharedDtor((TestCamelCaseFieldNames *)&stack0xffffffffffffffe0);
}

Assistant:

inline void TestCamelCaseFieldNames::SharedDtor(MessageLite& self) {
  TestCamelCaseFieldNames& this_ = static_cast<TestCamelCaseFieldNames&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.stringfield_.Destroy();
  this_._impl_.stringpiecefield_.Destroy();
  this_._impl_.cordfield_.Destroy();
  delete this_._impl_.messagefield_;
  this_._impl_.~Impl_();
}